

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

ArgSlot EmitArgList(ParseNode *pnode,RegSlot thisLocation,RegSlot newTargetLocation,BOOL fIsEval,
                   BOOL fAssignRegs,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                   ProfileId callSiteId,ArgSlot argsCountForStartCall,bool emitArgOutsAtEnd,
                   bool emitProfiledArgouts,uint16 spreadArgCount,
                   AuxArray<unsigned_int> **spreadIndices)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  RegSlot evalLocation;
  BOOL BVar4;
  undefined4 *puVar5;
  AuxArray<unsigned_int> *pAVar6;
  size_t argIndex;
  
  if (!emitArgOutsAtEnd) {
    Js::ByteCodeWriter::StartCall(&byteCodeGenerator->m_writer,StartCall,argsCountForStartCall);
    if (thisLocation != 0xffffffff) {
      Js::ByteCodeWriter::ArgOut<true>(&byteCodeGenerator->m_writer,0,thisLocation,callSiteId,false)
      ;
    }
  }
  if (fIsEval == 0) {
    evalLocation = 0xffffffff;
  }
  else {
    evalLocation = FuncInfo::AcquireTmpRegister(funcInfo);
  }
  if (spreadArgCount != 0) {
    if (spreadIndices == (AuxArray<unsigned_int> **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1dfe,"(spreadIndices != nullptr)","spreadIndices != nullptr");
      if (!bVar2) goto LAB_0081cad9;
      *puVar5 = 0;
    }
    this = &byteCodeGenerator->alloc->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_0081cad9;
      *puVar5 = 0;
    }
    pAVar6 = (AuxArray<unsigned_int> *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(this,(ulong)((uint)spreadArgCount * 4 + 4));
    if (pAVar6 == (AuxArray<unsigned_int> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_0081cad9:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    pAVar6->count = (uint)spreadArgCount;
    *spreadIndices = pAVar6;
  }
  if (emitArgOutsAtEnd) {
    if (spreadIndices == (AuxArray<unsigned_int> **)0x0) {
      pAVar6 = (AuxArray<unsigned_int> *)0x0;
    }
    else {
      pAVar6 = *spreadIndices;
    }
    argIndex = EmitArgsWithArgOutsAtEnd
                         (pnode,fAssignRegs,byteCodeGenerator,funcInfo,callSiteId,thisLocation,
                          argsCountForStartCall,emitProfiledArgouts,pAVar6);
  }
  else {
    if (spreadIndices == (AuxArray<unsigned_int> **)0x0) {
      pAVar6 = (AuxArray<unsigned_int> *)0x0;
    }
    else {
      pAVar6 = *spreadIndices;
    }
    argIndex = EmitArgs(pnode,fAssignRegs,byteCodeGenerator,funcInfo,callSiteId,emitProfiledArgouts,
                        pAVar6);
  }
  AVar3 = EmitArgListEnd(pnode,fAssignRegs,evalLocation,newTargetLocation,byteCodeGenerator,funcInfo
                         ,argIndex,callSiteId);
  if (fIsEval != 0) {
    FuncInfo::ReleaseTmpRegister(funcInfo,evalLocation);
  }
  return AVar3;
}

Assistant:

Js::ArgSlot EmitArgList(
    ParseNode *pnode,
    Js::RegSlot thisLocation,
    Js::RegSlot newTargetLocation,
    BOOL fIsEval,
    BOOL fAssignRegs,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    Js::ArgSlot argsCountForStartCall,
    bool emitArgOutsAtEnd,
    bool emitProfiledArgouts,
    uint16 spreadArgCount = 0,
    Js::AuxArray<uint32> **spreadIndices = nullptr)
{
    // This function emits the arguments for a call.
    // ArgOut's with uses immediately following defs.
    if (!emitArgOutsAtEnd)
    {
        byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argsCountForStartCall);
        EmitArgListStart(thisLocation, byteCodeGenerator, funcInfo, callSiteId);
    }

    Js::RegSlot evalLocation = Js::Constants::NoRegister;

    //
    // If Emitting arguments for eval and assigning registers, get a tmpLocation for eval.
    // This would be used while generating frameDisplay in EmitArgListEnd.
    //
    if (fIsEval)
    {
        evalLocation = funcInfo->AcquireTmpRegister();
    }

    if (spreadArgCount > 0)
    {
        const size_t extraAlloc = UInt32Math::Mul(spreadArgCount, sizeof(uint32));
        Assert(spreadIndices != nullptr);
        *spreadIndices = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<uint32>, spreadArgCount);
    }

    size_t argIndex = 0;
    if (emitArgOutsAtEnd)
    {
        argIndex = EmitArgsWithArgOutsAtEnd(pnode, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, thisLocation, argsCountForStartCall, emitProfiledArgouts, spreadIndices == nullptr ? nullptr : *spreadIndices);
    }
    else
    {
        argIndex = EmitArgs(pnode, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, emitProfiledArgouts, spreadIndices == nullptr ? nullptr : *spreadIndices);
    }

    Js::ArgSlot argumentsCount = EmitArgListEnd(pnode, thisLocation, evalLocation, newTargetLocation, byteCodeGenerator, funcInfo, argIndex, callSiteId);

    if (fIsEval)
    {
        funcInfo->ReleaseTmpRegister(evalLocation);
    }

    return argumentsCount;
}